

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

void __thiscall
mkvmuxer::Segment::MoveCuesBeforeClustersHelper
          (Segment *this,uint64_t diff,int32_t index,uint64_t *cues_size)

{
  CuePoint **ppCVar1;
  CuePoint *this_00;
  int32 iVar2;
  int32 iVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  int32_t i;
  int index_00;
  long lVar6;
  
  ppCVar1 = (this->cues_).cue_entries_;
  if (((ppCVar1 != (CuePoint **)0x0) && (index < (this->cues_).cue_entries_size_)) &&
     (this_00 = ppCVar1[index], this_00 != (CuePoint *)0x0)) {
    uVar4 = CuePoint::Size(this_00);
    this_00->cluster_pos_ = this_00->cluster_pos_ + diff;
    uVar5 = CuePoint::Size(this_00);
    lVar6 = uVar5 - uVar4;
    iVar2 = GetCodedUIntSize(*cues_size + lVar6);
    iVar3 = GetCodedUIntSize(*cues_size);
    *cues_size = *cues_size + lVar6;
    uVar4 = (iVar2 - iVar3) + lVar6;
    if (uVar4 != 0) {
      for (index_00 = 0; index_00 < (this->cues_).cue_entries_size_; index_00 = index_00 + 1) {
        MoveCuesBeforeClustersHelper(this,uVar4,index_00,cues_size);
      }
    }
  }
  return;
}

Assistant:

CuePoint* Cues::GetCueByIndex(int32_t index) const {
  if (cue_entries_ == NULL)
    return NULL;

  if (index >= cue_entries_size_)
    return NULL;

  return cue_entries_[index];
}